

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O1

void __thiscall PrintVisitor::visit(PrintVisitor *this,LambdaCallNode *node)

{
  LambdaNode *pLVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  long *plVar4;
  PrintVisitor visitor;
  long *local_68;
  long local_60;
  long local_58 [2];
  undefined **local_48;
  ostream *local_40;
  int local_38;
  
  poVar3 = this->stream_;
  local_68 = local_58;
  std::__cxx11::string::_M_construct((ulong)&local_68,(char)this->indentation_);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_68,local_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"LambdaCallNode:\n",0x10);
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  poVar3 = this->stream_;
  local_68 = local_58;
  std::__cxx11::string::_M_construct((ulong)&local_68,(char)this->indentation_);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_68,local_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Arguments:\n",0xb);
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  local_40 = this->stream_;
  local_38 = this->indentation_ + 1;
  local_48 = &PTR__Visitor_00156cf8;
  iVar2 = (*(node->super_CallNode).super_ExpressionNode.super_Node._vptr_Node[3])(node);
  plVar4 = (long *)CONCAT44(extraout_var,iVar2);
  while (plVar4 = (long *)*plVar4, plVar4 != (long *)CONCAT44(extraout_var,iVar2)) {
    (**(code **)(*(long *)plVar4[2] + 0x10))((long *)plVar4[2],&local_48);
  }
  poVar3 = this->stream_;
  local_68 = local_58;
  std::__cxx11::string::_M_construct((ulong)&local_68,(char)this->indentation_);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_68,local_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Lambda:\n",8);
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  pLVar1 = (node->lambda_)._M_t.super___uniq_ptr_impl<LambdaNode,_std::default_delete<LambdaNode>_>.
           _M_t.super__Tuple_impl<0UL,_LambdaNode_*,_std::default_delete<LambdaNode>_>.
           super__Head_base<0UL,_LambdaNode_*,_false>._M_head_impl;
  (**(code **)(*(long *)&(pLVar1->super_ExpressionNode).super_Node + 0x10))(pLVar1,&local_48);
  return;
}

Assistant:

void PrintVisitor::visit(const LambdaCallNode& node)
{
  stream_ << indent() << "LambdaCallNode:\n";
  stream_ << indent() << "Arguments:\n";
  auto visitor = PrintVisitor{stream_, indentation_ + 1};
  for(const auto& arg : node.getArguments())
  {
    arg->accept(visitor);
  }
  stream_ << indent() << "Lambda:\n";
  node.getLambda().accept(visitor);
}